

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::CompactReporter::testRunStarting(CompactReporter *this,TestRunInfo *param_1)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  char local_21;
  ColourGuard local_20;
  
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    local_20.m_colourImpl = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if (local_20.m_colourImpl == (ColourImpl *)0x0) {
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                    ,0x385,
                    "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]"
                   );
    }
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    local_20.m_code = BrightYellow;
    local_20.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_20,poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Filters: ",9);
    iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    TestSpec::serializeTo((TestSpec *)CONCAT44(extraout_var_00,iVar1),poVar2);
    local_21 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_21,1);
    if (local_20.m_engaged == true) {
      (*(local_20.m_colourImpl)->_vptr_ColourImpl[2])(local_20.m_colourImpl,0);
    }
  }
  poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"RNG seed: ",10);
  getSeed();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_20.m_colourImpl = (ColourImpl *)CONCAT71(local_20.m_colourImpl._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_20,1);
  return;
}

Assistant:

void CompactReporter::testRunStarting( TestRunInfo const& ) {
            if ( m_config->testSpec().hasFilters() ) {
                m_stream << m_colour->guardColour( Colour::BrightYellow )
                         << "Filters: "
                         << m_config->testSpec()
                         << '\n';
            }
            m_stream << "RNG seed: " << getSeed() << '\n';
        }